

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
dlib::
add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
::clean(add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
        *this)

{
  resizable_tensor::clear(&this->x_grad);
  resizable_tensor::clear(&this->cached_output);
  resizable_tensor::clear(&this->params_grad);
  resizable_tensor::clear(&this->temp_tensor);
  this->gradient_input_is_stale = true;
  add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>::clean
            ((this->subnetwork)._M_t.
             super___uniq_ptr_impl<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
             .
             super__Head_base<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_false>
             ._M_head_impl);
  return;
}

Assistant:

void clean()
        {
            x_grad.clear();
            cached_output.clear();
            params_grad.clear();
            temp_tensor.clear();
            gradient_input_is_stale = true;
            subnetwork->clean();
            call_clean_method_if_exists(details);
        }